

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.hpp
# Opt level: O0

string * SimpleWeb::Crypto::Base64::encode(string *__return_storage_ptr__,string *input)

{
  int iVar1;
  BUF_MEM *parg;
  BIO_METHOD *pBVar2;
  BIO *b;
  BIO *append;
  undefined8 uVar3;
  char *pcVar4;
  void *data;
  long lVar5;
  double dVar6;
  undefined1 auVar7 [16];
  size_t base64_length;
  BUF_MEM *bptr;
  BIO *b64;
  BIO *bio;
  string *input_local;
  string *base64;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  parg = BUF_MEM_new();
  pBVar2 = BIO_f_base64();
  b = BIO_new(pBVar2);
  BIO_set_flags(b,0x100);
  pBVar2 = BIO_s_mem();
  append = BIO_new(pBVar2);
  BIO_push(b,append);
  BIO_ctrl(b,0x72,1,parg);
  uVar3 = std::__cxx11::string::size();
  auVar7._8_4_ = (int)((ulong)uVar3 >> 0x20);
  auVar7._0_8_ = uVar3;
  auVar7._12_4_ = 0x45300000;
  dVar6 = ceil(((auVar7._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) / 3.0);
  dVar6 = round(dVar6 * 4.0);
  std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  parg->length = 0;
  parg->max = ((long)dVar6 | (long)(dVar6 - 9.223372036854776e+18) & (long)dVar6 >> 0x3f) + 1;
  pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
  parg->data = pcVar4;
  data = (void *)std::__cxx11::string::operator[]((ulong)input);
  iVar1 = std::__cxx11::string::size();
  iVar1 = BIO_write(b,data,iVar1);
  if ((iVar1 < 1) || (lVar5 = BIO_ctrl(b,0xb,0,(void *)0x0), (int)lVar5 < 1)) {
    std::__cxx11::string::clear();
  }
  parg->length = 0;
  parg->max = 0;
  parg->data = (char *)0x0;
  BIO_free_all(b);
  return __return_storage_ptr__;
}

Assistant:

static std::string encode(const std::string &input) noexcept {
        std::string base64;

        BIO *bio, *b64;
        BUF_MEM *bptr = BUF_MEM_new();

        b64 = BIO_new(BIO_f_base64());
        BIO_set_flags(b64, BIO_FLAGS_BASE64_NO_NL);
        bio = BIO_new(BIO_s_mem());
        BIO_push(b64, bio);
        BIO_set_mem_buf(b64, bptr, BIO_CLOSE);

        // Write directly to base64-buffer to avoid copy
        auto base64_length = static_cast<std::size_t>(round(4 * ceil(static_cast<double>(input.size()) / 3.0)));
        base64.resize(base64_length);
        bptr->length = 0;
        bptr->max = base64_length + 1;
        bptr->data = &base64[0];

        if(BIO_write(b64, &input[0], static_cast<int>(input.size())) <= 0 || BIO_flush(b64) <= 0)
          base64.clear();

        // To keep &base64[0] through BIO_free_all(b64)
        bptr->length = 0;
        bptr->max = 0;
        bptr->data = nullptr;

        BIO_free_all(b64);

        return base64;
      }